

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FunctionBody * __thiscall
ByteCodeGenerator::MakeGlobalFunctionBody(ByteCodeGenerator *this,ParseNode *pnode)

{
  uint nestedCount;
  uint uScriptId;
  ScriptContext *scriptContext;
  Utf8SourceInfo *sourceInfo;
  ParseNodeFnc *pPVar1;
  SRCINFO *this_00;
  SourceContextInfo *pSVar2;
  FunctionBody *this_01;
  JavascriptLibrary *this_02;
  FunctionBody *func;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  scriptContext = this->scriptContext;
  pPVar1 = ParseNode::AsParseNodeFnc(pnode);
  nestedCount = pPVar1->nestedCount;
  sourceInfo = this->m_utf8SourceInfo;
  this_00 = Js::Utf8SourceInfo::GetSrcInfo(this->m_utf8SourceInfo);
  pSVar2 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&this_00->sourceContextInfo);
  uScriptId = pSVar2->sourceContextId;
  pPVar1 = ParseNode::AsParseNodeFnc(pnode);
  this_01 = Js::FunctionBody::NewFromRecycler
                      (scriptContext,L"glo",3,0,nestedCount,sourceInfo,uScriptId,pPVar1->functionId,
                       None,Flags_HasNoExplicitReturnValue);
  Js::ParseableFunctionInfo::SetIsGlobalFunc(&this_01->super_ParseableFunctionInfo,true);
  this_02 = Js::ScriptContext::GetLibrary(this->scriptContext);
  Js::JavascriptLibrary::RegisterDynamicFunctionReference(this_02,(FunctionProxy *)this_01);
  return this_01;
}

Assistant:

Js::FunctionBody * ByteCodeGenerator::MakeGlobalFunctionBody(ParseNode *pnode)
{
    Js::FunctionBody * func;

    func =
        Js::FunctionBody::NewFromRecycler(
            scriptContext,
            Js::Constants::GlobalFunction,
            Js::Constants::GlobalFunctionLength,
            0,
            pnode->AsParseNodeFnc()->nestedCount,
            m_utf8SourceInfo,
            m_utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId,
            pnode->AsParseNodeFnc()->functionId,
            Js::FunctionInfo::Attributes::None,
            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
            , false /* is function from deferred deserialized proxy */
#endif
            );

    func->SetIsGlobalFunc(true);

    scriptContext->GetLibrary()->RegisterDynamicFunctionReference(func);

    return func;
}